

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O1

void R_SetupFrame(AActor *actor)

{
  extsector_t *peVar1;
  AActor *pAVar2;
  int iVar3;
  uint uVar4;
  InterpolationViewer *iview;
  subsector_t *psVar5;
  ulong uVar6;
  sector_t_conflict *psVar7;
  long lVar8;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *player;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  secplane_t *psVar13;
  bool bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  bool unlinked;
  DVector3 campos;
  DAngle camangle;
  bool local_c9;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  FQuakeJiggers local_a8;
  DAngle local_38;
  
  if (actor == (AActor *)0x0) {
    I_Error("Tried to render from a NULL actor.");
  }
  player = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)actor->player;
  local_c9 = false;
  camera = actor;
  if ((player != (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)0x0) &&
     (*(AActor **)player == actor)) {
    camera = player[0x2f].p;
    if ((camera != (AActor *)0x0) && ((*(byte *)((long)camera + 0x20) & 0x20) != 0)) {
      player[0x2f] = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)0x0;
      camera = (AActor *)0x0;
    }
    if (camera == (AActor *)0x0) {
      camera = *(AActor **)player;
      player[0x2f] = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)camera;
    }
  }
  if (camera == (AActor *)0x0) {
    I_Error("You lost your body. Bad dehacked work is likely to blame.");
  }
  iview = FindPastViewer(camera);
  iVar3 = (*I_GetTime)(false);
  if (iview->otic < iVar3 && iview->otic != -1) {
    iview->otic = iVar3;
    (iview->Old).Pos.Z = (iview->New).Pos.Z;
    dVar17 = (iview->New).Pos.Y;
    (iview->Old).Pos.X = (iview->New).Pos.X;
    (iview->Old).Pos.Y = dVar17;
    (iview->Old).Angles.Roll.Degrees = (iview->New).Angles.Roll.Degrees;
    dVar17 = (iview->New).Angles.Yaw.Degrees;
    (iview->Old).Angles.Pitch.Degrees = (iview->New).Angles.Pitch.Degrees;
    (iview->Old).Angles.Yaw.Degrees = dVar17;
  }
  if (((player == (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)0x0) ||
      (gamestate == GS_TITLELEVEL)) ||
     (((*(int *)(player + 0x1d) & 0x20) == 0 &&
      ((r_deathcamera.Value != true || (0 < camera->health)))))) {
    dVar17 = (camera->__Pos).X;
    uVar15 = SUB84(dVar17,0);
    uVar16 = (undefined4)((ulong)dVar17 >> 0x20);
    dVar18 = (camera->__Pos).Y;
    if (camera->player == (player_t *)0x0) {
      local_c0 = (camera->__Pos).Z;
      local_c8 = dVar18;
      local_b8 = dVar17;
      dVar17 = AActor::GetCameraHeight(camera);
      uVar15 = SUB84(local_b8,0);
      uVar16 = (undefined4)((ulong)local_b8 >> 0x20);
      dVar17 = dVar17 + local_c0;
      dVar18 = local_c8;
    }
    else {
      dVar17 = camera->player->viewz;
    }
    (iview->New).Pos.Z = dVar17;
    (iview->New).Pos.Y = dVar18;
    (iview->New).Pos.X = (double)CONCAT44(uVar16,uVar15);
    viewsector = camera->Sector;
    r_showviewer = false;
  }
  else {
    psVar5 = R_PointInSubsector(SUB84((iview->Old).Pos.X + 103079215104.0,0),
                                SUB84((iview->Old).Pos.Y + 103079215104.0,0));
    psVar7 = psVar5->sector;
    P_AimCamera(camera,&local_a8.Intensity,&local_38,(sector_t_conflict **)&viewsector,&local_c9);
    (iview->New).Pos.Z = local_a8.Intensity.Z;
    (iview->New).Pos.Y = local_a8.Intensity.Y;
    (iview->New).Pos.X = local_a8.Intensity.X;
    (iview->New).Angles.Yaw.Degrees = local_38.Degrees;
    r_showviewer = true;
    if ((viewsector->PortalGroup != psVar7->PortalGroup) ||
       ((local_c9 == true &&
        (dVar17 = local_a8.Intensity.X - (iview->Old).Pos.X,
        dVar18 = local_a8.Intensity.Y - (iview->Old).Pos.Y,
        65536.0 < dVar18 * dVar18 + dVar17 * dVar17)))) {
      iview->otic = iVar3;
      (iview->Old).Pos.Z = local_a8.Intensity.Z;
      (iview->Old).Pos.Y = local_a8.Intensity.Y;
      (iview->Old).Pos.X = local_a8.Intensity.X;
      (iview->Old).Angles.Roll.Degrees = (iview->New).Angles.Roll.Degrees;
      dVar17 = (iview->New).Angles.Yaw.Degrees;
      (iview->Old).Angles.Pitch.Degrees = (iview->New).Angles.Pitch.Degrees;
      (iview->Old).Angles.Yaw.Degrees = dVar17;
      r_NoInterpolate = true;
    }
  }
  pAVar2 = camera;
  (iview->New).Angles.Roll.Degrees = (camera->Angles).Roll.Degrees;
  (iview->New).Angles.Yaw.Degrees = (pAVar2->Angles).Yaw.Degrees;
  (iview->New).Angles.Pitch.Degrees = (pAVar2->Angles).Pitch.Degrees;
  if (pAVar2->player != (player_t *)0x0) {
    player = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 *)pAVar2->player;
  }
  if ((iview->otic == -1) || (r_NoInterpolate == true)) {
    if (InterpolationPath.Count != 0) {
      InterpolationPath.Count = 0;
    }
    NoInterpolateView = true;
    iview->otic = iVar3;
  }
  r_TicFracF = I_GetTimeFrac(&r_FrameTime);
  if ((cl_capfps.Value != false) || (r_NoInterpolate == true)) {
    r_TicFracF = 1.0;
  }
  R_InterpolateView((player_t *)player,r_TicFracF,iview);
  R_SetViewAngle();
  FInterpolator::DoInterpolations(&interpolator,r_TicFracF);
  if (((viewsector->planes[1].Flags & 0x1d0U) != 0x100) &&
     (dVar17 = (ViewPos.Y * (viewsector->ceilingplane).normal.Y +
               ViewPos.X * (viewsector->ceilingplane).normal.X + (viewsector->ceilingplane).D) *
               (viewsector->ceilingplane).negiC + -4.0, dVar17 < ViewPos.Z)) {
    ViewPos.Z = dVar17;
  }
  if (((viewsector->planes[0].Flags & 0x1d0U) != 0x100) &&
     (dVar17 = (ViewPos.Y * (viewsector->floorplane).normal.Y +
               ViewPos.X * (viewsector->floorplane).normal.X + (viewsector->floorplane).D) *
               (viewsector->floorplane).negiC + 4.0, ViewPos.Z < dVar17)) {
    ViewPos.Z = dVar17;
  }
  if (paused == 0) {
    local_a8.RollIntensity = 0.0;
    local_a8.RollWave = 0.0;
    local_a8.RelOffset.Y = 0.0;
    local_a8.RelOffset.Z = 0.0;
    local_a8.Offset.Z = 0.0;
    local_a8.RelOffset.X = 0.0;
    local_a8.Offset.X = 0.0;
    local_a8.Offset.Y = 0.0;
    local_a8.RelIntensity.Y = 0.0;
    local_a8.RelIntensity.Z = 0.0;
    local_a8.Intensity.Z = 0.0;
    local_a8.RelIntensity.X = 0.0;
    local_a8.Intensity.X = 0.0;
    local_a8.Intensity.Y = 0.0;
    iVar3 = DEarthquake::StaticGetQuakeIntensities(camera,&local_a8);
    if (0 < iVar3) {
      local_b8 = (double)r_quakeintensity.Value;
      uVar15 = SUB84(local_a8.RollWave,0);
      uVar16 = (undefined4)((ulong)local_a8.RollWave >> 0x20);
      dVar17 = 0.0;
      if ((((local_a8.RollIntensity != 0.0) || (NAN(local_a8.RollIntensity))) ||
          (local_a8.RollWave != 0.0)) || (NAN(local_a8.RollWave))) {
        if ((local_a8.RollIntensity != 0.0) || (NAN(local_a8.RollIntensity))) {
          local_c8 = local_a8.RollWave;
          local_c0 = local_a8.RollIntensity;
          uVar4 = FRandom::GenRand32(&pr_torchflicker);
          uVar15 = SUB84(local_c8,0);
          uVar16 = (undefined4)((ulong)local_c8 >> 0x20);
          dVar17 = (local_c0 + local_c0) * (double)uVar4 * 2.3283064365386963e-10 - local_c0;
        }
        ViewRoll.Degrees = ((double)CONCAT44(uVar16,uVar15) + dVar17) * local_b8 + ViewRoll.Degrees;
      }
      uVar15 = SUB84(local_a8.RelOffset.X,0);
      uVar16 = (undefined4)((ulong)local_a8.RelOffset.X >> 0x20);
      dVar17 = 0.0;
      if (((local_a8.RelIntensity.X != 0.0) || (NAN(local_a8.RelIntensity.X))) ||
         ((local_a8.RelOffset.X != 0.0 || (NAN(local_a8.RelOffset.X))))) {
        if ((local_a8.RelIntensity.X != 0.0) || (NAN(local_a8.RelIntensity.X))) {
          local_c8 = local_a8.RelOffset.X;
          local_b0 = local_a8.RelIntensity.X;
          local_c0 = (camera->Angles).Yaw.Degrees;
          uVar4 = FRandom::GenRand32(&pr_torchflicker);
          uVar15 = SUB84(local_c8,0);
          uVar16 = (undefined4)((ulong)local_c8 >> 0x20);
          dVar17 = (local_b0 + local_b0) * (double)uVar4 * 2.3283064365386963e-10 - local_b0;
        }
        local_c8 = ((double)CONCAT44(uVar16,uVar15) + dVar17) * local_b8;
        local_c0 = FFastTrig::cos(&fasttrig,dVar17);
        local_c0 = local_c0 * local_c8;
        dVar17 = FFastTrig::sin(&fasttrig,local_c0);
        ViewPos.X = local_c0 + ViewPos.X;
        ViewPos.Y = dVar17 * local_c8 + ViewPos.Y;
      }
      uVar15 = SUB84(local_a8.RelOffset.Y,0);
      uVar16 = (undefined4)((ulong)local_a8.RelOffset.Y >> 0x20);
      dVar17 = 0.0;
      if ((((local_a8.RelIntensity.Y != 0.0) || (NAN(local_a8.RelIntensity.Y))) ||
          (local_a8.RelOffset.Y != 0.0)) || (NAN(local_a8.RelOffset.Y))) {
        if ((local_a8.RelIntensity.Y != 0.0) || (NAN(local_a8.RelIntensity.Y))) {
          local_c8 = local_a8.RelOffset.Y;
          local_b0 = local_a8.RelIntensity.Y;
          local_c0 = (camera->Angles).Yaw.Degrees + 90.0;
          uVar4 = FRandom::GenRand32(&pr_torchflicker);
          uVar15 = SUB84(local_c8,0);
          uVar16 = (undefined4)((ulong)local_c8 >> 0x20);
          dVar17 = (local_b0 + local_b0) * (double)uVar4 * 2.3283064365386963e-10 - local_b0;
        }
        local_c8 = ((double)CONCAT44(uVar16,uVar15) + dVar17) * local_b8;
        local_c0 = FFastTrig::cos(&fasttrig,dVar17);
        local_c0 = local_c0 * local_c8;
        dVar17 = FFastTrig::sin(&fasttrig,local_c0);
        ViewPos.X = local_c0 + ViewPos.X;
        ViewPos.Y = dVar17 * local_c8 + ViewPos.Y;
      }
      uVar15 = SUB84(local_a8.RelOffset.Z,0);
      uVar16 = (undefined4)((ulong)local_a8.RelOffset.Z >> 0x20);
      dVar17 = 0.0;
      if (((local_a8.RelIntensity.Z != 0.0) || (NAN(local_a8.RelIntensity.Z))) ||
         ((local_a8.RelOffset.Z != 0.0 || (NAN(local_a8.RelOffset.Z))))) {
        if ((local_a8.RelIntensity.Z != 0.0) || (NAN(local_a8.RelIntensity.Z))) {
          local_c8 = local_a8.RelOffset.Z;
          local_c0 = local_a8.RelIntensity.Z;
          uVar4 = FRandom::GenRand32(&pr_torchflicker);
          uVar15 = SUB84(local_c8,0);
          uVar16 = (undefined4)((ulong)local_c8 >> 0x20);
          dVar17 = (local_c0 + local_c0) * (double)uVar4 * 2.3283064365386963e-10 - local_c0;
        }
        ViewPos.Z = ((double)CONCAT44(uVar16,uVar15) + dVar17) * local_b8 + ViewPos.Z;
      }
      uVar15 = SUB84(local_a8.Offset.X,0);
      uVar16 = (undefined4)((ulong)local_a8.Offset.X >> 0x20);
      dVar17 = 0.0;
      if ((((local_a8.Intensity.X != 0.0) || (NAN(local_a8.Intensity.X))) ||
          (local_a8.Offset.X != 0.0)) || (NAN(local_a8.Offset.X))) {
        if ((local_a8.Intensity.X != 0.0) || (NAN(local_a8.Intensity.X))) {
          local_c8 = local_a8.Offset.X;
          local_c0 = local_a8.Intensity.X;
          uVar4 = FRandom::GenRand32(&pr_torchflicker);
          uVar15 = SUB84(local_c8,0);
          uVar16 = (undefined4)((ulong)local_c8 >> 0x20);
          dVar17 = (local_c0 + local_c0) * (double)uVar4 * 2.3283064365386963e-10 - local_c0;
        }
        ViewPos.X = ((double)CONCAT44(uVar16,uVar15) + dVar17) * local_b8 + ViewPos.X;
      }
      uVar15 = SUB84(local_a8.Offset.Y,0);
      uVar16 = (undefined4)((ulong)local_a8.Offset.Y >> 0x20);
      dVar17 = 0.0;
      if (((local_a8.Intensity.Y != 0.0) || (NAN(local_a8.Intensity.Y))) ||
         ((local_a8.Offset.Y != 0.0 || (NAN(local_a8.Offset.Y))))) {
        if ((local_a8.Intensity.Y != 0.0) || (NAN(local_a8.Intensity.Y))) {
          local_c8 = local_a8.Offset.Y;
          local_c0 = local_a8.Intensity.Y;
          uVar4 = FRandom::GenRand32(&pr_torchflicker);
          uVar15 = SUB84(local_c8,0);
          uVar16 = (undefined4)((ulong)local_c8 >> 0x20);
          dVar17 = (local_c0 + local_c0) * (double)uVar4 * 2.3283064365386963e-10 - local_c0;
        }
        ViewPos.Y = ((double)CONCAT44(uVar16,uVar15) + dVar17) * local_b8 + ViewPos.Y;
      }
      uVar15 = SUB84(local_a8.Offset.Z,0);
      uVar16 = (undefined4)((ulong)local_a8.Offset.Z >> 0x20);
      dVar17 = 0.0;
      if ((((local_a8.Intensity.Z != 0.0) || (NAN(local_a8.Intensity.Z))) ||
          (local_a8.Offset.Z != 0.0)) || (NAN(local_a8.Offset.Z))) {
        if ((local_a8.Intensity.Z != 0.0) || (NAN(local_a8.Intensity.Z))) {
          local_c8 = local_a8.Offset.Z;
          local_c0 = local_a8.Intensity.Z;
          uVar4 = FRandom::GenRand32(&pr_torchflicker);
          uVar15 = SUB84(local_c8,0);
          uVar16 = (undefined4)((ulong)local_c8 >> 0x20);
          dVar17 = (local_c0 + local_c0) * (double)uVar4 * 2.3283064365386963e-10 - local_c0;
        }
        ViewPos.Z = ((double)CONCAT44(uVar16,uVar15) + dVar17) * local_b8 + ViewPos.Z;
      }
    }
  }
  if (camera->player == (player_t *)0x0) {
    extralight = 0;
  }
  else {
    extralight = camera->player->extralight;
  }
  peVar1 = viewsector->e;
  uVar4 = (peVar1->XFloor).lightlist.Count;
  if ((ulong)uVar4 == 0) {
    psVar7 = sector_t::GetHeightSec(viewsector);
    if (psVar7 == (sector_t_conflict *)0x0) {
      uVar6 = 0;
    }
    else {
      lVar8 = 0x1b0;
      if (-1.52587890625e-05 <=
          (psVar7->floorplane).normal.Z * ViewPos.Z +
          (psVar7->floorplane).normal.Y * ViewPos.Y + (psVar7->floorplane).normal.X * ViewPos.X +
          (psVar7->floorplane).D) {
        lVar8 = (ulong)(ViewPos.Z * (psVar7->ceilingplane).normal.Z +
                        ViewPos.Y * (psVar7->ceilingplane).normal.Y +
                        ViewPos.X * (psVar7->ceilingplane).normal.X + (psVar7->ceilingplane).D <
                       -1.52587890625e-05) * 4 + 0x1b4;
      }
      uVar4 = *(uint *)((long)&psVar7->planes[0].xform.xOffs + lVar8);
      uVar6 = (ulong)uVar4;
      if (uVar6 < 0x1000000) {
        uVar9 = 0;
        if (uVar6 < numfakecmaps) {
          uVar9 = uVar4;
        }
        uVar6 = (ulong)uVar9;
      }
    }
  }
  else {
    uVar11 = 0;
    uVar6 = 0;
    lVar8 = 0x50;
    do {
      psVar13 = &viewsector->floorplane;
      if (uVar11 < uVar4 - 1) {
        psVar13 = (secplane_t *)
                  ((long)&(((peVar1->XFloor).lightlist.Array)->plane).normal.X + lVar8);
      }
      dVar17 = (psVar13->normal).Z;
      dVar18 = dVar17 * ViewPos.Z +
               (psVar13->normal).Y * ViewPos.Y + (psVar13->normal).X * ViewPos.X + psVar13->D;
      uVar9 = (uint)(1.52587890625e-05 < dVar18);
      if (dVar18 < -1.52587890625e-05) {
        uVar9 = 0xffffffff;
      }
      uVar12 = -uVar9;
      if (0.0 <= dVar17) {
        uVar12 = uVar9;
      }
      if (0 < (int)uVar12) {
        uVar9 = *(uint *)((long)(peVar1->XFloor).lightlist.Array + lVar8 + -0x18);
        uVar10 = (uint)(uVar9 != 0) << 0x1f;
        if (0xffffff < uVar9) {
          uVar10 = uVar9 & 0xff000000;
        }
        uVar6 = (ulong)(uVar9 & 0xffffff | uVar10);
      }
      if (0 < (int)uVar12) break;
      uVar11 = uVar11 + 1;
      bVar14 = (ulong)uVar4 * 0x50 != lVar8;
      lVar8 = lVar8 + 0x50;
    } while (bVar14);
  }
  uVar4 = (uint)uVar6;
  if (R_OldBlend != uVar4) {
    R_OldBlend = uVar4;
    if (uVar4 < 0x1000000) {
      NormalLight.Maps = realcolormaps + (uVar4 << 0xd);
      BaseBlendB = 0;
      BaseBlendG = 0;
      BaseBlendR = 0;
      BaseBlendA = 0.0;
    }
    else {
      BaseBlendR = (uint)(uVar6 >> 0x10) & 0xff;
      BaseBlendG = (uint)(uVar6 >> 8) & 0xff;
      BaseBlendB = uVar4 & 0xff;
      BaseBlendA = (float)(int)(uVar6 >> 0x18) / 255.0;
      NormalLight.Maps = realcolormaps;
    }
  }
  (*Renderer->_vptr_FRenderer[0x12])();
  (*Renderer->_vptr_FRenderer[0x11])(Renderer,player);
  validcount = validcount + 1;
  if ((DFrameBuffer *)RenderTarget != screen) {
    return;
  }
  if (r_clearbuffer.Value == 0) {
    return;
  }
  iVar3 = r_clearbuffer.Value;
  if (r_clearbuffer.Value == 3) {
    uVar4 = I_FPSTime();
    iVar3 = ((uVar4 >> 7 & 1) != 0) + 1;
  }
  if (iVar3 == 4) {
    uVar4 = I_FPSTime();
    uVar4 = uVar4 >> 5;
  }
  else {
    if (iVar3 == 2) {
      uVar6 = (ulong)GPalette.WhiteIndex;
      goto LAB_00479441;
    }
    if (iVar3 == 1) {
      uVar6 = (ulong)GPalette.BlackIndex;
      goto LAB_00479441;
    }
    uVar4 = FRandom::GenRand32(&pr_hom);
  }
  uVar6 = (ulong)(uVar4 & 0xff);
LAB_00479441:
  (*Renderer->_vptr_FRenderer[0xe])(Renderer,uVar6);
  return;
}

Assistant:

void R_SetupFrame (AActor *actor)
{
	if (actor == NULL)
	{
		I_Error ("Tried to render from a NULL actor.");
	}

	player_t *player = actor->player;
	unsigned int newblend;
	InterpolationViewer *iview;
	bool unlinked = false;

	if (player != NULL && player->mo == actor)
	{	// [RH] Use camera instead of viewplayer
		camera = player->camera;
		if (camera == NULL)
		{
			camera = player->camera = player->mo;
		}
	}
	else
	{
		camera = actor;
	}

	if (camera == NULL)
	{
		I_Error ("You lost your body. Bad dehacked work is likely to blame.");
	}

	iview = FindPastViewer (camera);

	int nowtic = I_GetTime (false);
	if (iview->otic != -1 && nowtic > iview->otic)
	{
		iview->otic = nowtic;
		iview->Old = iview->New;
	}

	if (player != NULL && gamestate != GS_TITLELEVEL &&
		((player->cheats & CF_CHASECAM) || (r_deathcamera && camera->health <= 0)))
	{
		sector_t *oldsector = R_PointInSubsector(iview->Old.Pos)->sector;
		// [RH] Use chasecam view
		DVector3 campos;
		DAngle camangle;
		P_AimCamera (camera, campos, camangle, viewsector, unlinked);	// fixme: This needs to translate the angle, too.
		iview->New.Pos = campos;
		iview->New.Angles.Yaw = camangle;
		
		r_showviewer = true;
		// Interpolating this is a very complicated thing because nothing keeps track of the aim camera's movement, so whenever we detect a portal transition
		// it's probably best to just reset the interpolation for this move.
		// Note that this can still cause problems with unusually linked portals
		if (viewsector->PortalGroup != oldsector->PortalGroup || (unlinked && ((iview->New.Pos.XY() - iview->Old.Pos.XY()).LengthSquared()) > 256*256))
		{
			iview->otic = nowtic;
			iview->Old = iview->New;
			r_NoInterpolate = true;
		}
	}
	else
	{
		iview->New.Pos = { camera->Pos().XY(), camera->player ? camera->player->viewz : camera->Z() + camera->GetCameraHeight() };
		viewsector = camera->Sector;
		r_showviewer = false;
	}
	iview->New.Angles = camera->Angles;
	if (camera->player != 0)
	{
		player = camera->player;
	}

	if (iview->otic == -1 || r_NoInterpolate)
	{
		R_ResetViewInterpolation ();
		iview->otic = nowtic;
	}

	r_TicFracF = I_GetTimeFrac (&r_FrameTime);
	if (cl_capfps || r_NoInterpolate)
	{
		r_TicFracF = 1.;
	}
	R_InterpolateView (player, r_TicFracF, iview);

	R_SetViewAngle ();

	interpolator.DoInterpolations (r_TicFracF);

	// Keep the view within the sector's floor and ceiling
	if (viewsector->PortalBlocksMovement(sector_t::ceiling))
	{
		double theZ = viewsector->ceilingplane.ZatPoint(ViewPos) - 4;
		if (ViewPos.Z > theZ)
		{
			ViewPos.Z = theZ;
		}
	}

	if (viewsector->PortalBlocksMovement(sector_t::floor))
	{
		double theZ = viewsector->floorplane.ZatPoint(ViewPos) + 4;
		if (ViewPos.Z < theZ)
		{
			ViewPos.Z = theZ;
		}
	}

	if (!paused)
	{
		FQuakeJiggers jiggers;

		memset(&jiggers, 0, sizeof(jiggers));
		if (DEarthquake::StaticGetQuakeIntensities(camera, jiggers) > 0)
		{
			double quakefactor = r_quakeintensity;
			DAngle an;

			if (jiggers.RollIntensity != 0 || jiggers.RollWave != 0)
			{
				ViewRoll += QuakePower(quakefactor, jiggers.RollIntensity, jiggers.RollWave);
			}
			if (jiggers.RelIntensity.X != 0 || jiggers.RelOffset.X != 0)
			{
				an = camera->Angles.Yaw;
				double power = QuakePower(quakefactor, jiggers.RelIntensity.X, jiggers.RelOffset.X);
				ViewPos += an.ToVector(power);
			}
			if (jiggers.RelIntensity.Y != 0 || jiggers.RelOffset.Y != 0)
			{
				an = camera->Angles.Yaw + 90;
				double power = QuakePower(quakefactor, jiggers.RelIntensity.Y, jiggers.RelOffset.Y);
				ViewPos += an.ToVector(power);
			}
			// FIXME: Relative Z is not relative
			if (jiggers.RelIntensity.Z != 0 || jiggers.RelOffset.Z != 0)
			{
				ViewPos.Z += QuakePower(quakefactor, jiggers.RelIntensity.Z, jiggers.RelOffset.Z);
			}
			if (jiggers.Intensity.X != 0 || jiggers.Offset.X != 0)
			{
				ViewPos.X += QuakePower(quakefactor, jiggers.Intensity.X, jiggers.Offset.X);
			}
			if (jiggers.Intensity.Y != 0 || jiggers.Offset.Y != 0)
			{
				ViewPos.Y += QuakePower(quakefactor, jiggers.Intensity.Y, jiggers.Offset.Y);
			}
			if (jiggers.Intensity.Z != 0 || jiggers.Offset.Z != 0)
			{
				ViewPos.Z += QuakePower(quakefactor, jiggers.Intensity.Z, jiggers.Offset.Z);
			}
		}
	}

	extralight = camera->player ? camera->player->extralight : 0;

	// killough 3/20/98, 4/4/98: select colormap based on player status
	// [RH] Can also select a blend
	newblend = 0;

	TArray<lightlist_t> &lightlist = viewsector->e->XFloor.lightlist;
	if (lightlist.Size() > 0)
	{
		for(unsigned int i = 0; i < lightlist.Size(); i++)
		{
			secplane_t *plane;
			int viewside;
			plane = (i < lightlist.Size()-1) ? &lightlist[i+1].plane : &viewsector->floorplane;
			viewside = plane->PointOnSide(ViewPos);
			// Reverse the direction of the test if the plane was downward facing.
			// We want to know if the view is above it, whatever its orientation may be.
			if (plane->fC() < 0)
				viewside = -viewside;
			if (viewside > 0)
			{
				// 3d floor 'fog' is rendered as a blending value
				PalEntry blendv = lightlist[i].blend;

				// If no alpha is set, use 50%
				if (blendv.a==0 && blendv!=0) blendv.a=128;
				newblend = blendv.d;
				break;
			}
		}
	}
	else
	{
		const sector_t *s = viewsector->GetHeightSec();
		if (s != NULL)
		{
			newblend = s->floorplane.PointOnSide(ViewPos) < 0
				? s->bottommap
				: s->ceilingplane.PointOnSide(ViewPos) < 0
				? s->topmap
				: s->midmap;
			if (APART(newblend) == 0 && newblend >= numfakecmaps)
				newblend = 0;
		}
	}

	// [RH] Don't override testblend unless entering a sector with a
	//		blend different from the previous sector's. Same goes with
	//		NormalLight's maps pointer.
	if (R_OldBlend != newblend)
	{
		R_OldBlend = newblend;
		if (APART(newblend))
		{
			BaseBlendR = RPART(newblend);
			BaseBlendG = GPART(newblend);
			BaseBlendB = BPART(newblend);
			BaseBlendA = APART(newblend) / 255.f;
			NormalLight.Maps = realcolormaps;
		}
		else
		{
			NormalLight.Maps = realcolormaps + NUMCOLORMAPS*256*newblend;
			BaseBlendR = BaseBlendG = BaseBlendB = 0;
			BaseBlendA = 0.f;
		}
	}

	Renderer->CopyStackedViewParameters();
	Renderer->SetupFrame(player);

	validcount++;

	if (RenderTarget == screen && r_clearbuffer != 0)
	{
		int color;
		int hom = r_clearbuffer;

		if (hom == 3)
		{
			hom = ((I_FPSTime() / 128) & 1) + 1;
		}
		if (hom == 1)
		{
			color = GPalette.BlackIndex;
		}
		else if (hom == 2)
		{
			color = GPalette.WhiteIndex;
		}
		else if (hom == 4)
		{
			color = (I_FPSTime() / 32) & 255;
		}
		else
		{
			color = pr_hom();
		}
		Renderer->ClearBuffer(color);
	}
}